

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_compressBlock_doubleFast_extDict_generic
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 U32 mls)

{
  long *iEnd;
  long *iStart;
  long *plVar1;
  undefined8 *puVar2;
  uint uVar3;
  uint uVar4;
  ZSTD_longLengthType_e ZVar5;
  BYTE *pBVar6;
  U32 *pUVar7;
  U32 *pUVar8;
  BYTE *pBVar9;
  int *op;
  uint uVar10;
  int iVar11;
  undefined8 uVar12;
  uint uVar13;
  uint uVar14;
  long *plVar15;
  long *ilimit_w;
  size_t sVar16;
  long *plVar17;
  BYTE *pBVar18;
  byte bVar19;
  byte bVar20;
  U32 UVar21;
  long *plVar22;
  BYTE *pBVar23;
  long *plVar24;
  long *plVar25;
  uint uVar26;
  long lVar27;
  int iVar28;
  long *plVar29;
  seqDef *psVar30;
  ulong uVar31;
  BYTE *pBVar32;
  uint uVar33;
  int iVar35;
  U32 UVar36;
  U32 UVar37;
  BYTE *litEnd;
  long *plVar38;
  uint uVar39;
  U32 UVar40;
  ulong uVar41;
  BYTE *litLimit_w;
  ulong uVar34;
  
  iEnd = (long *)((long)src + srcSize);
  pBVar6 = (ms->window).base;
  iVar35 = (int)pBVar6;
  iVar28 = (int)iEnd - iVar35;
  uVar13 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar3 = (ms->window).lowLimit;
  uVar10 = iVar28 - uVar13;
  if (iVar28 - uVar3 <= uVar13) {
    uVar10 = uVar3;
  }
  if (ms->loadedDictEnd != 0) {
    uVar10 = uVar3;
  }
  uVar3 = (ms->window).dictLimit;
  if (uVar3 <= uVar10) {
    sVar16 = ZSTD_compressBlock_doubleFast(ms,seqStore,rep,src,srcSize);
    return sVar16;
  }
  plVar15 = (long *)((long)src + (srcSize - 8));
  UVar40 = *rep;
  UVar36 = rep[1];
  if (src < plVar15) {
    uVar13 = (ms->cParams).chainLog;
    iVar28 = uVar13 - 0x20;
    if (0x1f < uVar13 && iVar28 != 0) {
LAB_001ae102:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
    }
    pUVar7 = ms->hashTable;
    uVar13 = (ms->cParams).hashLog;
    pUVar8 = ms->chainTable;
    pBVar9 = (ms->window).dictBase;
    iStart = (long *)(pBVar6 + uVar3);
    plVar22 = (long *)(pBVar9 + uVar10);
    plVar1 = (long *)(pBVar9 + uVar3);
    bVar19 = -(char)iVar28;
    bVar20 = 0x40 - (char)uVar13;
    ilimit_w = iEnd + -4;
    uVar33 = mls - 5;
    uVar34 = (ulong)uVar33;
    plVar25 = (long *)src;
    do {
      if (uVar33 < 4) {
        sVar16 = (*(code *)(&DAT_002fa7cc + *(int *)(&DAT_002fa7cc + uVar34 * 4)))();
        return sVar16;
      }
      uVar14 = (uint)((int)*plVar25 * -0x61c8864f) >> (bVar19 & 0x1f);
      uVar39 = pUVar8[uVar14];
      pBVar18 = pBVar6;
      if (uVar39 < uVar3) {
        pBVar18 = pBVar9;
      }
      if (0x20 < uVar13) goto LAB_001ae102;
      lVar27 = *plVar25;
      uVar31 = (ulong)(lVar27 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f);
      uVar4 = pUVar7[uVar31];
      pBVar23 = pBVar6;
      if (uVar4 < uVar3) {
        pBVar23 = pBVar9;
      }
      UVar37 = (int)plVar25 - iVar35;
      UVar21 = UVar37 + 1;
      uVar26 = UVar21 - UVar40;
      pUVar7[uVar31] = UVar37;
      pBVar32 = pBVar6;
      if (uVar26 < uVar3) {
        pBVar32 = pBVar9;
      }
      pUVar8[uVar14] = UVar37;
      if (((UVar21 - uVar10 < UVar40) || ((uVar3 - 1) - uVar26 < 3)) ||
         (*(int *)(pBVar32 + uVar26) != *(int *)((long)plVar25 + 1))) {
        plVar38 = plVar25;
        if ((uVar10 < uVar4) && (plVar24 = (long *)(pBVar23 + uVar4), *plVar24 == lVar27)) {
          plVar29 = iStart;
          plVar17 = iEnd;
          if (uVar4 < uVar3) {
            plVar29 = plVar22;
            plVar17 = plVar1;
          }
          sVar16 = ZSTD_count_2segments
                             ((BYTE *)(plVar25 + 1),(BYTE *)(plVar24 + 1),(BYTE *)iEnd,
                              (BYTE *)plVar17,(BYTE *)iStart);
          uVar31 = sVar16 + 8;
          if ((plVar29 < plVar24) && (src < plVar25)) {
            plVar24 = (long *)(pBVar23 + uVar4);
            do {
              plVar24 = (long *)((long)plVar24 + -1);
              plVar17 = (long *)((long)plVar25 + -1);
              plVar38 = plVar25;
              if ((*(BYTE *)plVar17 != *(BYTE *)plVar24) ||
                 (uVar31 = uVar31 + 1, plVar38 = plVar17, plVar24 <= plVar29)) break;
              plVar25 = plVar17;
            } while (src < plVar17);
          }
          UVar21 = UVar37 - uVar4;
          if (UVar21 == 0) {
            __assert_fail("(offset)>0",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x6f4f,
                          "size_t ZSTD_compressBlock_doubleFast_extDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                         );
          }
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_001ae0a5;
          if (0x20000 < seqStore->maxNbLit) goto LAB_001ae0c4;
          uVar41 = (long)plVar38 - (long)src;
          plVar25 = (long *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar25 + uVar41))
          goto LAB_001ae048;
          if (iEnd < plVar38) goto LAB_001ae067;
          if (ilimit_w < plVar38) {
LAB_001adb53:
            ZSTD_safecopyLiterals((BYTE *)plVar25,(BYTE *)src,(BYTE *)plVar38,(BYTE *)ilimit_w);
            goto LAB_001adb7c;
          }
          lVar27 = *(long *)((long)src + 8);
          *plVar25 = *src;
          plVar25[1] = lVar27;
          pBVar18 = seqStore->lit;
          if (0x10 < uVar41) {
            if (0xffffffffffffffe0 < (ulong)((long)(pBVar18 + 0x10) + (-0x10 - ((long)src + 0x10))))
            goto LAB_001ae15f;
            lVar27 = *(long *)((long)src + 0x18);
            *(long *)(pBVar18 + 0x10) = *(long *)((long)src + 0x10);
            *(long *)(pBVar18 + 0x18) = lVar27;
            if (0x20 < (long)uVar41) {
              lVar27 = 0;
              do {
                puVar2 = (undefined8 *)((long)src + lVar27 + 0x20);
                uVar12 = puVar2[1];
                pBVar23 = pBVar18 + lVar27 + 0x20;
                *(undefined8 *)pBVar23 = *puVar2;
                *(undefined8 *)(pBVar23 + 8) = uVar12;
                puVar2 = (undefined8 *)((long)src + lVar27 + 0x30);
                uVar12 = puVar2[1];
                *(undefined8 *)(pBVar23 + 0x10) = *puVar2;
                *(undefined8 *)(pBVar23 + 0x18) = uVar12;
                lVar27 = lVar27 + 0x20;
              } while (pBVar23 + 0x20 < pBVar18 + uVar41);
            }
            goto LAB_001adb7c;
          }
LAB_001adc4a:
          seqStore->lit = pBVar18 + uVar41;
LAB_001adc5f:
          psVar30 = seqStore->sequences;
          psVar30->litLength = (U16)uVar41;
          psVar30->offBase = UVar21 + 3;
          if (uVar31 < 3) {
LAB_001ae086:
            __assert_fail("matchLength >= MINMATCH",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46aa,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          uVar41 = uVar31 - 3;
          UVar36 = UVar40;
          if (0xffff < uVar41) {
            ZVar5 = seqStore->longLengthType;
            UVar40 = UVar21;
            goto joined_r0x001adc8e;
          }
          goto LAB_001adcb0;
        }
        if ((uVar10 < uVar39) &&
           (plVar24 = (long *)(pBVar18 + uVar39), (int)*plVar24 == (int)*plVar25)) {
          lVar27 = *(long *)((long)plVar25 + 1);
          uVar31 = (ulong)(lVar27 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f);
          uVar14 = pUVar7[uVar31];
          pBVar23 = pBVar6;
          if (uVar14 < uVar3) {
            pBVar23 = pBVar9;
          }
          pUVar7[uVar31] = UVar21;
          if ((uVar10 < uVar14) && (plVar17 = (long *)(pBVar23 + uVar14), *plVar17 == lVar27)) {
            plVar38 = (long *)((long)plVar25 + 1);
            plVar29 = iStart;
            plVar24 = iEnd;
            if (uVar14 < uVar3) {
              plVar29 = plVar22;
              plVar24 = plVar1;
            }
            sVar16 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar25 + 9),(BYTE *)(plVar17 + 1),(BYTE *)iEnd,
                                (BYTE *)plVar24,(BYTE *)iStart);
            uVar31 = sVar16 + 8;
            UVar21 = UVar21 - uVar14;
            if ((plVar29 < plVar17) && (src < plVar38)) {
              plVar24 = (long *)(pBVar23 + uVar14);
              while (plVar38 = plVar25, plVar24 = (long *)((long)plVar24 + -1),
                    (BYTE)*plVar38 == *(BYTE *)plVar24) {
                uVar31 = uVar31 + 1;
                if ((plVar24 <= plVar29) || (plVar25 = (long *)((long)plVar38 + -1), plVar38 <= src)
                   ) goto LAB_001adaf0;
              }
              plVar38 = (long *)((long)plVar38 + 1);
            }
          }
          else {
            plVar29 = iStart;
            plVar17 = iEnd;
            if (uVar39 < uVar3) {
              plVar29 = plVar22;
              plVar17 = plVar1;
            }
            sVar16 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar25 + 4),(BYTE *)((long)plVar24 + 4),(BYTE *)iEnd
                                ,(BYTE *)plVar17,(BYTE *)iStart);
            uVar31 = sVar16 + 4;
            UVar21 = UVar37 - uVar39;
            if ((plVar29 < plVar24) && (src < plVar25)) {
              plVar24 = (long *)(pBVar18 + uVar39);
              do {
                plVar24 = (long *)((long)plVar24 + -1);
                plVar17 = (long *)((long)plVar25 + -1);
                plVar38 = plVar25;
                if ((*(BYTE *)plVar17 != *(BYTE *)plVar24) ||
                   (uVar31 = uVar31 + 1, plVar38 = plVar17, plVar24 <= plVar29)) break;
                plVar25 = plVar17;
              } while (src < plVar17);
            }
          }
LAB_001adaf0:
          if (UVar21 == 0) {
            __assert_fail("(offset)>0",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x6f68,
                          "size_t ZSTD_compressBlock_doubleFast_extDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                         );
          }
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_001ae0a5;
          if (0x20000 < seqStore->maxNbLit) goto LAB_001ae0c4;
          uVar41 = (long)plVar38 - (long)src;
          plVar25 = (long *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar25 + uVar41))
          goto LAB_001ae048;
          if (iEnd < plVar38) goto LAB_001ae067;
          if (ilimit_w < plVar38) goto LAB_001adb53;
          lVar27 = *(long *)((long)src + 8);
          *plVar25 = *src;
          plVar25[1] = lVar27;
          pBVar18 = seqStore->lit;
          if (uVar41 < 0x11) goto LAB_001adc4a;
          if (0xffffffffffffffe0 < (ulong)((long)(pBVar18 + 0x10) + (-0x10 - ((long)src + 0x10))))
          goto LAB_001ae15f;
          lVar27 = *(long *)((long)src + 0x18);
          *(long *)(pBVar18 + 0x10) = *(long *)((long)src + 0x10);
          *(long *)(pBVar18 + 0x18) = lVar27;
          if (0x20 < (long)uVar41) {
            lVar27 = 0;
            do {
              puVar2 = (undefined8 *)((long)src + lVar27 + 0x20);
              uVar12 = puVar2[1];
              pBVar23 = pBVar18 + lVar27 + 0x20;
              *(undefined8 *)pBVar23 = *puVar2;
              *(undefined8 *)(pBVar23 + 8) = uVar12;
              puVar2 = (undefined8 *)((long)src + lVar27 + 0x30);
              uVar12 = puVar2[1];
              *(undefined8 *)(pBVar23 + 0x10) = *puVar2;
              *(undefined8 *)(pBVar23 + 0x18) = uVar12;
              lVar27 = lVar27 + 0x20;
            } while (pBVar23 + 0x20 < pBVar18 + uVar41);
          }
LAB_001adb7c:
          seqStore->lit = seqStore->lit + uVar41;
          if (0xffff < uVar41) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001ae121;
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          goto LAB_001adc5f;
        }
        plVar25 = (long *)((long)plVar25 + ((long)plVar25 - (long)src >> 8) + 1);
      }
      else {
        plVar38 = iEnd;
        if (uVar26 < uVar3) {
          plVar38 = plVar1;
        }
        sVar16 = ZSTD_count_2segments
                           ((BYTE *)((long)plVar25 + 5),(BYTE *)((long)(pBVar32 + uVar26) + 4),
                            (BYTE *)iEnd,(BYTE *)plVar38,(BYTE *)iStart);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_001ae0a5:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < seqStore->maxNbLit) {
LAB_001ae0c4:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        plVar38 = (long *)((long)plVar25 + 1);
        uVar41 = (long)plVar38 - (long)src;
        plVar25 = (long *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar25 + uVar41)) {
LAB_001ae048:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468e,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (iEnd < plVar38) {
LAB_001ae067:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (ilimit_w < plVar38) {
          ZSTD_safecopyLiterals((BYTE *)plVar25,(BYTE *)src,(BYTE *)plVar38,(BYTE *)ilimit_w);
LAB_001ad5cd:
          seqStore->lit = seqStore->lit + uVar41;
          if (0xffff < uVar41) {
            if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_001ae121:
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x46a0,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          lVar27 = *(long *)((long)src + 8);
          *plVar25 = *src;
          plVar25[1] = lVar27;
          pBVar18 = seqStore->lit;
          if (0x10 < uVar41) {
            if (0xffffffffffffffe0 < (ulong)((long)(pBVar18 + 0x10) + (-0x10 - ((long)src + 0x10))))
            {
LAB_001ae15f:
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x36a6,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            lVar27 = *(long *)((long)src + 0x18);
            *(long *)(pBVar18 + 0x10) = *(long *)((long)src + 0x10);
            *(long *)(pBVar18 + 0x18) = lVar27;
            if (0x20 < (long)uVar41) {
              lVar27 = 0;
              do {
                puVar2 = (undefined8 *)((long)src + lVar27 + 0x20);
                uVar12 = puVar2[1];
                pBVar23 = pBVar18 + lVar27 + 0x20;
                *(undefined8 *)pBVar23 = *puVar2;
                *(undefined8 *)(pBVar23 + 8) = uVar12;
                puVar2 = (undefined8 *)((long)src + lVar27 + 0x30);
                uVar12 = puVar2[1];
                *(undefined8 *)(pBVar23 + 0x10) = *puVar2;
                *(undefined8 *)(pBVar23 + 0x18) = uVar12;
                lVar27 = lVar27 + 0x20;
              } while (pBVar23 + 0x20 < pBVar18 + uVar41);
            }
            goto LAB_001ad5cd;
          }
          seqStore->lit = pBVar18 + uVar41;
        }
        uVar31 = sVar16 + 4;
        psVar30 = seqStore->sequences;
        psVar30->litLength = (U16)uVar41;
        psVar30->offBase = 1;
        if (uVar31 < 3) goto LAB_001ae086;
        uVar41 = sVar16 + 1;
        UVar21 = UVar40;
        if (0xffff < uVar41) {
          ZVar5 = seqStore->longLengthType;
joined_r0x001adc8e:
          if (ZVar5 != ZSTD_llt_none) {
LAB_001ae0e3:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46ad,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar30 - (long)seqStore->sequencesStart) >> 3);
          UVar21 = UVar40;
        }
LAB_001adcb0:
        UVar40 = UVar21;
        src = (void *)(uVar31 + (long)plVar38);
        psVar30->mlBase = (U16)uVar41;
        psVar30 = psVar30 + 1;
        seqStore->sequences = psVar30;
        plVar25 = (long *)src;
        if (src <= plVar15) {
          uVar39 = UVar37 + 2;
          pUVar7[(ulong)(*(long *)(pBVar6 + uVar39) * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] =
               uVar39;
          pUVar7[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] =
               ((int)src + -2) - iVar35;
          if (uVar33 < 4) {
            sVar16 = (*(code *)(&DAT_002fa7dc + *(int *)(&DAT_002fa7dc + uVar34 * 4)))();
            return sVar16;
          }
          pUVar8[(uint)(*(int *)(pBVar6 + uVar39) * -0x61c8864f) >> (bVar19 & 0x1f)] = uVar39;
          pUVar8[(uint)(*(int *)((long)src + -1) * -0x61c8864f) >> (bVar19 & 0x1f)] =
               ((int)src + -1) - iVar35;
          do {
            UVar21 = UVar40;
            UVar37 = (int)src - iVar35;
            uVar39 = UVar37 - UVar36;
            pBVar18 = pBVar6;
            if (uVar39 < uVar3) {
              pBVar18 = pBVar9;
            }
            plVar25 = (long *)src;
            UVar40 = UVar21;
            if (((UVar37 - uVar10 < UVar36) || ((uVar3 - 1) - uVar39 < 3)) ||
               (*(int *)(pBVar18 + uVar39) != (int)*src)) break;
            plVar25 = iEnd;
            if (uVar39 < uVar3) {
              plVar25 = plVar1;
            }
            sVar16 = ZSTD_count_2segments
                               ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar18 + uVar39) + 4),
                                (BYTE *)iEnd,(BYTE *)plVar25,(BYTE *)iStart);
            if (seqStore->maxNbSeq <= (ulong)((long)psVar30 - (long)seqStore->sequencesStart >> 3))
            goto LAB_001ae0a5;
            if (0x20000 < seqStore->maxNbLit) goto LAB_001ae0c4;
            op = (int *)seqStore->lit;
            if (seqStore->litStart + seqStore->maxNbLit < op) goto LAB_001ae048;
            if (iEnd < src) goto LAB_001ae067;
            if (ilimit_w < src) {
              ZSTD_safecopyLiterals((BYTE *)op,(BYTE *)src,(BYTE *)src,(BYTE *)ilimit_w);
            }
            else {
              iVar28 = *(int *)((long)src + 4);
              lVar27 = *(long *)((long)src + 8);
              iVar11 = *(int *)((long)src + 0xc);
              *op = (int)*src;
              op[1] = iVar28;
              op[2] = (int)lVar27;
              op[3] = iVar11;
            }
            psVar30 = seqStore->sequences;
            psVar30->litLength = 0;
            psVar30->offBase = 1;
            if (sVar16 + 4 < 3) goto LAB_001ae086;
            if (0xffff < sVar16 + 1) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001ae0e3;
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar30 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar30->mlBase = (U16)(sVar16 + 1);
            psVar30 = psVar30 + 1;
            seqStore->sequences = psVar30;
            if (uVar33 < 4) {
              sVar16 = (*(code *)(&DAT_002fa7ec + *(int *)(&DAT_002fa7ec + uVar34 * 4)))();
              return sVar16;
            }
            lVar27 = *src;
            pUVar8[(uint)((int)*src * -0x61c8864f) >> (bVar19 & 0x1f)] = UVar37;
            pUVar7[(ulong)(lVar27 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] = UVar37;
            src = (void *)((long)src + sVar16 + 4);
            plVar25 = (long *)src;
            UVar40 = UVar36;
            UVar36 = UVar21;
          } while (src <= plVar15);
        }
      }
    } while (plVar25 < plVar15);
  }
  *rep = UVar40;
  rep[1] = UVar36;
  return (long)iEnd - (long)src;
}

Assistant:

static size_t ZSTD_compressBlock_doubleFast_extDict_generic(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize,
        U32 const mls /* template */)
{
    ZSTD_compressionParameters const* cParams = &ms->cParams;
    U32* const hashLong = ms->hashTable;
    U32  const hBitsL = cParams->hashLog;
    U32* const hashSmall = ms->chainTable;
    U32  const hBitsS = cParams->chainLog;
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* ip = istart;
    const BYTE* anchor = istart;
    const BYTE* const iend = istart + srcSize;
    const BYTE* const ilimit = iend - 8;
    const BYTE* const base = ms->window.base;
    const U32   endIndex = (U32)((size_t)(istart - base) + srcSize);
    const U32   lowLimit = ZSTD_getLowestMatchIndex(ms, endIndex, cParams->windowLog);
    const U32   dictStartIndex = lowLimit;
    const U32   dictLimit = ms->window.dictLimit;
    const U32   prefixStartIndex = (dictLimit > lowLimit) ? dictLimit : lowLimit;
    const BYTE* const prefixStart = base + prefixStartIndex;
    const BYTE* const dictBase = ms->window.dictBase;
    const BYTE* const dictStart = dictBase + dictStartIndex;
    const BYTE* const dictEnd = dictBase + prefixStartIndex;
    U32 offset_1=rep[0], offset_2=rep[1];

    DEBUGLOG(5, "ZSTD_compressBlock_doubleFast_extDict_generic (srcSize=%zu)", srcSize);

    /* if extDict is invalidated due to maxDistance, switch to "regular" variant */
    if (prefixStartIndex == dictStartIndex)
        return ZSTD_compressBlock_doubleFast(ms, seqStore, rep, src, srcSize);

    /* Search Loop */
    while (ip < ilimit) {  /* < instead of <=, because (ip+1) */
        const size_t hSmall = ZSTD_hashPtr(ip, hBitsS, mls);
        const U32 matchIndex = hashSmall[hSmall];
        const BYTE* const matchBase = matchIndex < prefixStartIndex ? dictBase : base;
        const BYTE* match = matchBase + matchIndex;

        const size_t hLong = ZSTD_hashPtr(ip, hBitsL, 8);
        const U32 matchLongIndex = hashLong[hLong];
        const BYTE* const matchLongBase = matchLongIndex < prefixStartIndex ? dictBase : base;
        const BYTE* matchLong = matchLongBase + matchLongIndex;

        const U32 curr = (U32)(ip-base);
        const U32 repIndex = curr + 1 - offset_1;   /* offset_1 expected <= curr +1 */
        const BYTE* const repBase = repIndex < prefixStartIndex ? dictBase : base;
        const BYTE* const repMatch = repBase + repIndex;
        size_t mLength;
        hashSmall[hSmall] = hashLong[hLong] = curr;   /* update hash table */

        if ((((U32)((prefixStartIndex-1) - repIndex) >= 3) /* intentional underflow : ensure repIndex doesn't overlap dict + prefix */
            & (offset_1 <= curr+1 - dictStartIndex)) /* note: we are searching at curr+1 */
          && (MEM_read32(repMatch) == MEM_read32(ip+1)) ) {
            const BYTE* repMatchEnd = repIndex < prefixStartIndex ? dictEnd : iend;
            mLength = ZSTD_count_2segments(ip+1+4, repMatch+4, iend, repMatchEnd, prefixStart) + 4;
            ip++;
            ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, REPCODE1_TO_OFFBASE, mLength);
        } else {
            if ((matchLongIndex > dictStartIndex) && (MEM_read64(matchLong) == MEM_read64(ip))) {
                const BYTE* const matchEnd = matchLongIndex < prefixStartIndex ? dictEnd : iend;
                const BYTE* const lowMatchPtr = matchLongIndex < prefixStartIndex ? dictStart : prefixStart;
                U32 offset;
                mLength = ZSTD_count_2segments(ip+8, matchLong+8, iend, matchEnd, prefixStart) + 8;
                offset = curr - matchLongIndex;
                while (((ip>anchor) & (matchLong>lowMatchPtr)) && (ip[-1] == matchLong[-1])) { ip--; matchLong--; mLength++; }   /* catch up */
                offset_2 = offset_1;
                offset_1 = offset;
                ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, OFFSET_TO_OFFBASE(offset), mLength);

            } else if ((matchIndex > dictStartIndex) && (MEM_read32(match) == MEM_read32(ip))) {
                size_t const h3 = ZSTD_hashPtr(ip+1, hBitsL, 8);
                U32 const matchIndex3 = hashLong[h3];
                const BYTE* const match3Base = matchIndex3 < prefixStartIndex ? dictBase : base;
                const BYTE* match3 = match3Base + matchIndex3;
                U32 offset;
                hashLong[h3] = curr + 1;
                if ( (matchIndex3 > dictStartIndex) && (MEM_read64(match3) == MEM_read64(ip+1)) ) {
                    const BYTE* const matchEnd = matchIndex3 < prefixStartIndex ? dictEnd : iend;
                    const BYTE* const lowMatchPtr = matchIndex3 < prefixStartIndex ? dictStart : prefixStart;
                    mLength = ZSTD_count_2segments(ip+9, match3+8, iend, matchEnd, prefixStart) + 8;
                    ip++;
                    offset = curr+1 - matchIndex3;
                    while (((ip>anchor) & (match3>lowMatchPtr)) && (ip[-1] == match3[-1])) { ip--; match3--; mLength++; } /* catch up */
                } else {
                    const BYTE* const matchEnd = matchIndex < prefixStartIndex ? dictEnd : iend;
                    const BYTE* const lowMatchPtr = matchIndex < prefixStartIndex ? dictStart : prefixStart;
                    mLength = ZSTD_count_2segments(ip+4, match+4, iend, matchEnd, prefixStart) + 4;
                    offset = curr - matchIndex;
                    while (((ip>anchor) & (match>lowMatchPtr)) && (ip[-1] == match[-1])) { ip--; match--; mLength++; }   /* catch up */
                }
                offset_2 = offset_1;
                offset_1 = offset;
                ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, OFFSET_TO_OFFBASE(offset), mLength);

            } else {
                ip += ((ip-anchor) >> kSearchStrength) + 1;
                continue;
        }   }

        /* move to next sequence start */
        ip += mLength;
        anchor = ip;

        if (ip <= ilimit) {
            /* Complementary insertion */
            /* done after iLimit test, as candidates could be > iend-8 */
            {   U32 const indexToInsert = curr+2;
                hashLong[ZSTD_hashPtr(base+indexToInsert, hBitsL, 8)] = indexToInsert;
                hashLong[ZSTD_hashPtr(ip-2, hBitsL, 8)] = (U32)(ip-2-base);
                hashSmall[ZSTD_hashPtr(base+indexToInsert, hBitsS, mls)] = indexToInsert;
                hashSmall[ZSTD_hashPtr(ip-1, hBitsS, mls)] = (U32)(ip-1-base);
            }

            /* check immediate repcode */
            while (ip <= ilimit) {
                U32 const current2 = (U32)(ip-base);
                U32 const repIndex2 = current2 - offset_2;
                const BYTE* repMatch2 = repIndex2 < prefixStartIndex ? dictBase + repIndex2 : base + repIndex2;
                if ( (((U32)((prefixStartIndex-1) - repIndex2) >= 3)   /* intentional overflow : ensure repIndex2 doesn't overlap dict + prefix */
                    & (offset_2 <= current2 - dictStartIndex))
                  && (MEM_read32(repMatch2) == MEM_read32(ip)) ) {
                    const BYTE* const repEnd2 = repIndex2 < prefixStartIndex ? dictEnd : iend;
                    size_t const repLength2 = ZSTD_count_2segments(ip+4, repMatch2+4, iend, repEnd2, prefixStart) + 4;
                    U32 const tmpOffset = offset_2; offset_2 = offset_1; offset_1 = tmpOffset;   /* swap offset_2 <=> offset_1 */
                    ZSTD_storeSeq(seqStore, 0, anchor, iend, REPCODE1_TO_OFFBASE, repLength2);
                    hashSmall[ZSTD_hashPtr(ip, hBitsS, mls)] = current2;
                    hashLong[ZSTD_hashPtr(ip, hBitsL, 8)] = current2;
                    ip += repLength2;
                    anchor = ip;
                    continue;
                }
                break;
    }   }   }

    /* save reps for next block */
    rep[0] = offset_1;
    rep[1] = offset_2;

    /* Return the last literals size */
    return (size_t)(iend - anchor);
}